

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void CLI::detail::remove_default_flag_values(string *flags)

{
  size_type sVar1;
  char *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 local_90;
  char local_81;
  char *local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined8 local_68;
  undefined8 local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  undefined8 local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  long local_20;
  size_type finish;
  size_type loc;
  string *flags_local;
  
  loc = (size_type)flags;
  finish = ::std::__cxx11::string::find_first_of((char)flags,0x7b);
  while (sVar1 = loc, finish != 0xffffffffffffffff) {
    local_20 = ::std::__cxx11::string::find_first_of((char *)loc,0x1ad87e);
    if (local_20 != -1) {
      pcVar2 = (char *)::std::__cxx11::string::operator[](loc);
      sVar1 = loc;
      if (*pcVar2 == '}') {
        local_38._M_current = (char *)::std::__cxx11::string::begin();
        local_30 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_38,finish);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
        local_58._M_current = (char *)::std::__cxx11::string::begin();
        local_50 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_58,local_20);
        local_48 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_50,1);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_40,&local_48);
        local_60 = ::std::__cxx11::string::erase(sVar1,local_28,local_40);
      }
    }
    finish = ::std::__cxx11::string::find_first_of((char)loc,0x7b);
  }
  local_78._M_current = (char *)::std::__cxx11::string::begin();
  local_80 = (char *)::std::__cxx11::string::end();
  local_81 = '!';
  local_70 = ::std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (local_78,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_80,&local_81);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_68,&local_70);
  local_98._M_current = (char *)::std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_90,&local_98);
  ::std::__cxx11::string::erase(sVar1,local_68,local_90);
  return;
}

Assistant:

inline void remove_default_flag_values(std::string &flags) {
    auto loc = flags.find_first_of('{');
    while(loc != std::string::npos) {
        auto finish = flags.find_first_of("},", loc + 1);
        if((finish != std::string::npos) && (flags[finish] == '}')) {
            flags.erase(flags.begin() + static_cast<std::ptrdiff_t>(loc),
                        flags.begin() + static_cast<std::ptrdiff_t>(finish) + 1);
        }
        loc = flags.find_first_of('{', loc + 1);
    }
    flags.erase(std::remove(flags.begin(), flags.end(), '!'), flags.end());
}